

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  float fVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  options_00;
  byte bVar2;
  Error EVar3;
  char *pcVar4;
  Options *pOVar5;
  OptionAdder *pOVar6;
  size_t sVar7;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *this;
  OptionValue *pOVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  ostream *poVar10;
  reference pvVar11;
  streamoff sVar12;
  reference pvVar13;
  byte *pbVar14;
  size_type sVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  bool local_1549;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1528;
  int local_13c4;
  int local_13c0;
  int i_7;
  int i_6;
  uint8_t data_3;
  FILE *fp_3;
  undefined8 local_13a8;
  size_type local_13a0;
  size_t length_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes_2;
  ifstream fs_2;
  int local_1178;
  uint8_t local_1171;
  int i_5;
  uint8_t data_2;
  FILE *fp_2;
  undefined8 local_1160;
  size_type local_1158;
  size_t length_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes_1;
  ifstream fs_1;
  int local_f28;
  uint8_t b;
  int j;
  uint8_t byte;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range2;
  undefined8 local_f00;
  size_type local_ef8;
  size_t length;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  ifstream fs;
  undefined1 local_cc8 [4];
  Error err_2;
  vector<float,_std::allocator<float>_> content_2;
  File write_file;
  int i_4;
  uint8_t val_1;
  double currentSample_1;
  size_t i_3;
  int i_2;
  int iStack_c84;
  uint8_t data_1;
  uint8_t bitcounter_1;
  uint8_t prevVal_1;
  uint8_t bit_1;
  bool firstPart_1;
  int cnt_1;
  size_t numSamples_1;
  FILE *fp_1;
  undefined1 local_c68 [4];
  Error err_1;
  vector<float,_std::allocator<float>_> content_1;
  File read_file_1;
  int i_1;
  uint8_t val;
  double currentSample;
  size_t i;
  byte local_c28;
  char local_c27;
  undefined1 local_c26;
  byte local_c25;
  int iStack_c24;
  uint8_t data;
  uint8_t bitcounter;
  uint8_t prevVal;
  uint8_t bit;
  bool firstPart;
  int cnt;
  size_t numSamples;
  FILE *fp;
  undefined1 local_c08 [4];
  Error err;
  vector<float,_std::allocator<float>_> content;
  File read_file;
  OptionException *e;
  string local_bd8;
  allocator local_bb1;
  string local_bb0;
  allocator local_b89;
  string local_b88;
  allocator local_b61;
  string local_b60;
  allocator local_b39;
  string local_b38;
  byte local_b13;
  byte local_b12;
  allocator local_b11;
  string local_b10;
  byte local_aeb;
  byte local_aea;
  allocator local_ae9;
  string local_ae8;
  byte local_ac3;
  byte local_ac2;
  allocator local_ac1;
  string local_ac0;
  byte local_a9b;
  byte local_a9a;
  allocator local_a99;
  string local_a98;
  allocator local_a71;
  string local_a70;
  byte local_a4b;
  byte local_a4a;
  allocator local_a49;
  string local_a48;
  byte local_a23;
  byte local_a22;
  allocator local_a21;
  string local_a20;
  byte local_9fb;
  byte local_9fa;
  allocator local_9f9;
  string local_9f8;
  byte local_9d3;
  byte local_9d2;
  allocator local_9d1;
  string local_9d0;
  allocator local_9a9;
  string local_9a8;
  allocator local_981;
  string local_980;
  allocator local_959;
  string local_958;
  int local_938;
  allocator local_931;
  string local_930;
  allocator local_909;
  string local_908;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8e8;
  string local_8c8;
  allocator local_8a1;
  string local_8a0;
  undefined1 local_880 [8];
  ParseResult result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  string local_7b0 [32];
  iterator local_790;
  size_type local_788;
  allocator local_779;
  string local_778;
  shared_ptr<cxxopts::Value> local_758;
  shared_ptr<const_cxxopts::Value> local_748;
  allocator local_731;
  string local_730;
  allocator local_709;
  string local_708;
  allocator local_6e1;
  string local_6e0;
  shared_ptr<cxxopts::Value> local_6c0;
  shared_ptr<const_cxxopts::Value> local_6b0;
  allocator local_699;
  string local_698;
  allocator local_671;
  string local_670;
  allocator local_649;
  string local_648;
  shared_ptr<cxxopts::Value> local_628;
  shared_ptr<const_cxxopts::Value> local_618;
  allocator local_601;
  string local_600;
  allocator local_5d9;
  string local_5d8;
  allocator local_5b1;
  string local_5b0;
  shared_ptr<cxxopts::Value> local_590;
  shared_ptr<const_cxxopts::Value> local_580;
  allocator local_569;
  string local_568;
  allocator local_541;
  string local_540;
  allocator local_519;
  string local_518;
  shared_ptr<cxxopts::Value> local_4f8;
  shared_ptr<const_cxxopts::Value> local_4e8;
  allocator local_4d1;
  string local_4d0;
  allocator local_4a9;
  string local_4a8;
  allocator local_481;
  string local_480;
  shared_ptr<cxxopts::Value> local_460;
  shared_ptr<const_cxxopts::Value> local_450;
  allocator local_439;
  string local_438;
  allocator local_411;
  string local_410;
  allocator local_3e9;
  string local_3e8;
  shared_ptr<cxxopts::Value> local_3c8;
  shared_ptr<const_cxxopts::Value> local_3b8;
  allocator local_3a1;
  string local_3a0;
  allocator local_379;
  string local_378;
  allocator local_351;
  string local_350;
  shared_ptr<cxxopts::Value> local_330;
  shared_ptr<const_cxxopts::Value> local_320;
  allocator local_309;
  string local_308;
  allocator local_2e1;
  string local_2e0;
  allocator local_2b9;
  string local_2b8;
  OptionAdder local_298;
  allocator local_269;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  allocator local_221;
  string local_220;
  undefined1 local_200 [8];
  Options options;
  allocator local_81;
  undefined1 local_80 [8];
  string name;
  undefined1 local_58 [3];
  bool new_to_old;
  bool old_to_new;
  bool tap_to_wav;
  bool wav_to_oldtap;
  bool wav_to_tap;
  string output_file;
  string input_file;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  std::__cxx11::string::string((string *)(output_file.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_58);
  name.field_2._M_local_buf[0xf] = '\0';
  name.field_2._M_local_buf[0xe] = '\0';
  name.field_2._M_local_buf[0xd] = '\0';
  name.field_2._M_local_buf[0xc] = '\0';
  name.field_2._M_local_buf[0xb] = '\0';
  pcVar4 = *argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_80,pcVar4,&local_81);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,pcVar4,&local_221);
  std::operator+(&local_248,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 " - Orao cassette tape tool");
  cxxopts::Options::Options((Options *)local_200,&local_220,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_268,"[optional args]",&local_269);
  pOVar5 = cxxopts::Options::positional_help((Options *)local_200,&local_268);
  cxxopts::Options::show_positional_help(pOVar5);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  pOVar5 = cxxopts::Options::allow_unrecognised_options((Options *)local_200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b8,"",&local_2b9);
  cxxopts::Options::add_options(&local_298,pOVar5,&local_2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e0,"i,input",&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_308,"Input",&local_309);
  cxxopts::value<std::__cxx11::string>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_320,&local_330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_350,"",&local_351);
  pOVar6 = cxxopts::OptionAdder::operator()(&local_298,&local_2e0,&local_308,&local_320,&local_350);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_378,"o,output",&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a0,"Output file",&local_3a1);
  cxxopts::value<std::__cxx11::string>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_3b8,&local_3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e8,"",&local_3e9);
  pOVar6 = cxxopts::OptionAdder::operator()(pOVar6,&local_378,&local_3a0,&local_3b8,&local_3e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_410,"tap",&local_411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_438,"Convert WAV to TAP",&local_439);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_450,&local_460);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_480,"",&local_481);
  pOVar6 = cxxopts::OptionAdder::operator()(pOVar6,&local_410,&local_438,&local_450,&local_480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4a8,"oldtap",&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d0,"Convert WAV to oldTAP",&local_4d1);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_4e8,&local_4f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_518,"",&local_519);
  pOVar6 = cxxopts::OptionAdder::operator()(pOVar6,&local_4a8,&local_4d0,&local_4e8,&local_518);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_540,"wav",&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_568,"Convert TAP to WAV",&local_569);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_580,&local_590);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5b0,"",&local_5b1);
  pOVar6 = cxxopts::OptionAdder::operator()(pOVar6,&local_540,&local_568,&local_580,&local_5b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5d8,"old2new",&local_5d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_600,"Convert old TAP to new TAP",&local_601);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_618,&local_628);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_648,"",&local_649);
  pOVar6 = cxxopts::OptionAdder::operator()(pOVar6,&local_5d8,&local_600,&local_618,&local_648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_670,"new2old",&local_671);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_698,"Convert new TAP to old TAP <WARNING: header will not be good>",
             &local_699);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_6b0,&local_6c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6e0,"",&local_6e1);
  pOVar6 = cxxopts::OptionAdder::operator()(pOVar6,&local_670,&local_698,&local_6b0,&local_6e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_708,"help",&local_709);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_730,"Print help",&local_731);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_748,&local_758);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_778,"",&local_779);
  cxxopts::OptionAdder::operator()(pOVar6,&local_708,&local_730,&local_748,&local_778);
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator((allocator<char> *)&local_779);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_748);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_758);
  std::__cxx11::string::~string((string *)&local_730);
  std::allocator<char>::~allocator((allocator<char> *)&local_731);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator((allocator<char> *)&local_709);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_6b0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_6c0);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  std::__cxx11::string::~string((string *)&local_670);
  std::allocator<char>::~allocator((allocator<char> *)&local_671);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator((allocator<char> *)&local_649);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_618);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_628);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator((allocator<char> *)&local_601);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_580);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_590);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_4e8);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_4f8);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_450);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_460);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_3b8);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_3c8);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_320);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_330);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  cxxopts::OptionAdder::~OptionAdder(&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  result.m_unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7d0,"input",
             (allocator *)
             ((long)&result.m_unmatched.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7b0,"output",
             (allocator *)
             ((long)&result.m_unmatched.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  result.m_unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  local_790 = &local_7d0;
  local_788 = 2;
  options_00._M_len = 2;
  options_00._M_array = local_790;
  cxxopts::Options::parse_positional((Options *)local_200,options_00);
  local_1528 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_790;
  do {
    local_1528 = local_1528 + -1;
    std::__cxx11::string::~string((string *)local_1528);
  } while (local_1528 != &local_7d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&result.m_unmatched.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&result.m_unmatched.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cxxopts::Options::parse((ParseResult *)local_880,(Options *)local_200,argc,argv);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8a0,"help",&local_8a1);
  sVar7 = cxxopts::ParseResult::count((ParseResult *)local_880,&local_8a0);
  local_1549 = true;
  if (sVar7 == 0) {
    this = cxxopts::ParseResult::arguments((ParseResult *)local_880);
    local_1549 = std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::empty(this);
  }
  std::__cxx11::string::~string((string *)&local_8a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a1);
  if (local_1549 != false) {
    local_8e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_8e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_8e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_8e8);
    cxxopts::Options::help(&local_8c8,(Options *)local_200,&local_8e8);
    poVar10 = std::operator<<((ostream *)&std::cout,(string *)&local_8c8);
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_8c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_8e8);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_908,"input",&local_909);
  sVar7 = cxxopts::ParseResult::count((ParseResult *)local_880,&local_908);
  std::__cxx11::string::~string((string *)&local_908);
  std::allocator<char>::~allocator((allocator<char> *)&local_909);
  if (sVar7 == 0) {
    poVar10 = std::operator<<((ostream *)&std::cerr,"Input file is mandatory.");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
    local_938 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_930,"input",&local_931);
    pOVar8 = cxxopts::ParseResult::operator[]((ParseResult *)local_880,&local_930);
    pbVar9 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar8);
    std::__cxx11::string::operator=
              ((string *)(output_file.field_2._M_local_buf + 8),(string *)pbVar9);
    std::__cxx11::string::~string((string *)&local_930);
    std::allocator<char>::~allocator((allocator<char> *)&local_931);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_958,"output",&local_959);
    sVar7 = cxxopts::ParseResult::count((ParseResult *)local_880,&local_958);
    std::__cxx11::string::~string((string *)&local_958);
    std::allocator<char>::~allocator((allocator<char> *)&local_959);
    if (sVar7 == 0) {
      poVar10 = std::operator<<((ostream *)&std::cerr,"Output file is mandatory.");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
      local_938 = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_980,"output",&local_981);
      pOVar8 = cxxopts::ParseResult::operator[]((ParseResult *)local_880,&local_980);
      pbVar9 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar8);
      std::__cxx11::string::operator=((string *)local_58,(string *)pbVar9);
      std::__cxx11::string::~string((string *)&local_980);
      std::allocator<char>::~allocator((allocator<char> *)&local_981);
      std::allocator<char>::allocator();
      local_9d2 = 0;
      local_9d3 = 0;
      local_9fa = 0;
      local_9fb = 0;
      local_a22 = 0;
      local_a23 = 0;
      local_a4a = 0;
      local_a4b = 0;
      std::__cxx11::string::string((string *)&local_9a8,"wav",&local_9a9);
      sVar7 = cxxopts::ParseResult::count((ParseResult *)local_880,&local_9a8);
      bVar16 = false;
      if (sVar7 != 0) {
        std::allocator<char>::allocator();
        local_9d2 = 1;
        std::__cxx11::string::string((string *)&local_9d0,"tap",&local_9d1);
        local_9d3 = 1;
        sVar7 = cxxopts::ParseResult::count((ParseResult *)local_880,&local_9d0);
        bVar16 = false;
        if (sVar7 != 0) {
          std::allocator<char>::allocator();
          local_9fa = 1;
          std::__cxx11::string::string((string *)&local_9f8,"old2new",&local_9f9);
          local_9fb = 1;
          sVar7 = cxxopts::ParseResult::count((ParseResult *)local_880,&local_9f8);
          bVar16 = false;
          if (sVar7 != 0) {
            std::allocator<char>::allocator();
            local_a22 = 1;
            std::__cxx11::string::string((string *)&local_a20,"new2old",&local_a21);
            local_a23 = 1;
            sVar7 = cxxopts::ParseResult::count((ParseResult *)local_880,&local_a20);
            bVar16 = false;
            if (sVar7 != 0) {
              std::allocator<char>::allocator();
              local_a4a = 1;
              std::__cxx11::string::string((string *)&local_a48,"oldtap",&local_a49);
              local_a4b = 1;
              sVar7 = cxxopts::ParseResult::count((ParseResult *)local_880,&local_a48);
              bVar16 = sVar7 != 0;
            }
          }
        }
      }
      if ((local_a4b & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_a48);
      }
      if ((local_a4a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_a49);
      }
      if ((local_a23 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_a20);
      }
      if ((local_a22 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_a21);
      }
      if ((local_9fb & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_9f8);
      }
      if ((local_9fa & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_9f9);
      }
      if ((local_9d3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_9d0);
      }
      if ((local_9d2 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_9d1);
      }
      std::__cxx11::string::~string((string *)&local_9a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_9a9);
      if (bVar16) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Only one target format is possible.");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
        local_938 = 1;
      }
      else {
        std::allocator<char>::allocator();
        local_a9a = 0;
        local_a9b = 0;
        local_ac2 = 0;
        local_ac3 = 0;
        local_aea = 0;
        local_aeb = 0;
        local_b12 = 0;
        local_b13 = 0;
        std::__cxx11::string::string((string *)&local_a70,"wav",&local_a71);
        sVar7 = cxxopts::ParseResult::count((ParseResult *)local_880,&local_a70);
        bVar16 = false;
        if (sVar7 == 0) {
          std::allocator<char>::allocator();
          local_a9a = 1;
          std::__cxx11::string::string((string *)&local_a98,"tap",&local_a99);
          local_a9b = 1;
          sVar7 = cxxopts::ParseResult::count((ParseResult *)local_880,&local_a98);
          bVar16 = false;
          if (sVar7 == 0) {
            std::allocator<char>::allocator();
            local_ac2 = 1;
            std::__cxx11::string::string((string *)&local_ac0,"old2new",&local_ac1);
            local_ac3 = 1;
            sVar7 = cxxopts::ParseResult::count((ParseResult *)local_880,&local_ac0);
            bVar16 = false;
            if (sVar7 == 0) {
              std::allocator<char>::allocator();
              local_aea = 1;
              std::__cxx11::string::string((string *)&local_ae8,"new2old",&local_ae9);
              local_aeb = 1;
              sVar7 = cxxopts::ParseResult::count((ParseResult *)local_880,&local_ae8);
              bVar16 = false;
              if (sVar7 == 0) {
                std::allocator<char>::allocator();
                local_b12 = 1;
                std::__cxx11::string::string((string *)&local_b10,"oldtap",&local_b11);
                local_b13 = 1;
                sVar7 = cxxopts::ParseResult::count((ParseResult *)local_880,&local_b10);
                bVar16 = sVar7 == 0;
              }
            }
          }
        }
        if ((local_b13 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_b10);
        }
        if ((local_b12 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_b11);
        }
        if ((local_aeb & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_ae8);
        }
        if ((local_aea & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_ae9);
        }
        if ((local_ac3 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_ac0);
        }
        if ((local_ac2 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_ac1);
        }
        if ((local_a9b & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_a98);
        }
        if ((local_a9a & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_a99);
        }
        std::__cxx11::string::~string((string *)&local_a70);
        std::allocator<char>::~allocator((allocator<char> *)&local_a71);
        if (bVar16) {
          poVar10 = std::operator<<((ostream *)&std::cerr,"Target format is mandatory.");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          argv_local._4_4_ = 1;
          local_938 = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_b38,"wav",&local_b39);
          sVar7 = cxxopts::ParseResult::count((ParseResult *)local_880,&local_b38);
          std::__cxx11::string::~string((string *)&local_b38);
          std::allocator<char>::~allocator((allocator<char> *)&local_b39);
          if (sVar7 != 0) {
            name.field_2._M_local_buf[0xd] = '\x01';
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_b60,"tap",&local_b61);
          sVar7 = cxxopts::ParseResult::count((ParseResult *)local_880,&local_b60);
          std::__cxx11::string::~string((string *)&local_b60);
          std::allocator<char>::~allocator((allocator<char> *)&local_b61);
          if (sVar7 != 0) {
            name.field_2._M_local_buf[0xf] = '\x01';
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_b88,"oldtap",&local_b89);
          sVar7 = cxxopts::ParseResult::count((ParseResult *)local_880,&local_b88);
          std::__cxx11::string::~string((string *)&local_b88);
          std::allocator<char>::~allocator((allocator<char> *)&local_b89);
          if (sVar7 != 0) {
            name.field_2._M_local_buf[0xe] = '\x01';
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_bb0,"old2new",&local_bb1);
          sVar7 = cxxopts::ParseResult::count((ParseResult *)local_880,&local_bb0);
          std::__cxx11::string::~string((string *)&local_bb0);
          std::allocator<char>::~allocator((allocator<char> *)&local_bb1);
          if (sVar7 != 0) {
            name.field_2._M_local_buf[0xc] = '\x01';
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_bd8,"new2old",(allocator *)((long)&e + 7));
          sVar7 = cxxopts::ParseResult::count((ParseResult *)local_880,&local_bd8);
          std::__cxx11::string::~string((string *)&local_bd8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
          if (sVar7 != 0) {
            name.field_2._M_local_buf[0xb] = '\x01';
          }
          local_938 = 0;
        }
      }
    }
  }
  cxxopts::ParseResult::~ParseResult((ParseResult *)local_880);
  cxxopts::Options::~Options((Options *)local_200);
  std::__cxx11::string::~string((string *)local_80);
  if (local_938 == 0) {
    if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
      if ((name.field_2._M_local_buf[0xe] & 1U) == 0) {
        if ((name.field_2._M_local_buf[0xd] & 1U) == 0) {
          if ((name.field_2._M_local_buf[0xc] & 1U) != 0) {
            std::ifstream::ifstream
                      (&bytes_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (string *)(output_file.field_2._M_local_buf + 8),_S_bin);
            bVar2 = std::ios::operator!((ios *)((long)&bytes_1.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               + *(long *)(bytes_1.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + -0x18)));
            if ((bVar2 & 1) == 0) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&length_1);
              poVar10 = std::operator<<((ostream *)&std::cout,
                                        "Converting Orao old TAP tape to new TAP format.");
              std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
              std::istream::seekg((long)&bytes_1.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,_S_beg);
              auVar17 = std::istream::tellg();
              local_1160 = auVar17._8_8_;
              fp_2 = auVar17._0_8_;
              local_1158 = std::fpos::operator_cast_to_long((fpos *)&fp_2);
              std::istream::seekg((long)&bytes_1.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,_S_beg);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&length_1,
                         local_1158);
              pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &length_1,0);
              std::istream::read((char *)&bytes_1.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)pvVar13);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              _i_5 = fopen(pcVar4,"wb");
              local_1171 = 'O';
              fwrite(&local_1171,1,1,_i_5);
              for (local_1178 = 0x168;
                  sVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &length_1), (ulong)(long)local_1178 < sVar15;
                  local_1178 = local_1178 + 1) {
                pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     &length_1,(long)local_1178);
                local_1171 = reverse(*pvVar13);
                fwrite(&local_1171,1,1,_i_5);
              }
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&length_1);
              local_938 = 0;
            }
            else {
              poVar10 = std::operator<<((ostream *)&std::cerr,"Failed to open input file");
              std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
              argv_local._4_4_ = 1;
              local_938 = 1;
            }
            std::ifstream::~ifstream
                      (&bytes_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            if (local_938 != 0) goto LAB_0010bc2f;
          }
          if ((name.field_2._M_local_buf[0xb] & 1U) != 0) {
            std::ifstream::ifstream
                      (&bytes_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (string *)(output_file.field_2._M_local_buf + 8),_S_bin);
            bVar2 = std::ios::operator!((ios *)((long)&bytes_2.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               + *(long *)(bytes_2.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + -0x18)));
            if ((bVar2 & 1) == 0) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&length_2);
              poVar10 = std::operator<<((ostream *)&std::cout,
                                        "Converting Orao new TAP tape to old TAP format.");
              std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
              poVar10 = std::operator<<((ostream *)&std::cout,
                                        "WARNING: Header is not formed well, so some emulators may not work."
                                       );
              std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
              std::istream::seekg((long)&bytes_2.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,_S_beg);
              auVar17 = std::istream::tellg();
              local_13a8 = auVar17._8_8_;
              fp_3 = auVar17._0_8_;
              local_13a0 = std::fpos::operator_cast_to_long((fpos *)&fp_3);
              std::istream::seekg((long)&bytes_2.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,_S_beg);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&length_2,
                         local_13a0);
              pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &length_2,0);
              std::istream::read((char *)&bytes_2.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)pvVar13);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              _i_6 = fopen(pcVar4,"wb");
              i_7._3_1_ = 0x68;
              fwrite((void *)((long)&i_7 + 3),1,1,_i_6);
              i_7._3_1_ = 1;
              fwrite((void *)((long)&i_7 + 3),1,1,_i_6);
              i_7._3_1_ = '\0';
              fwrite((void *)((long)&i_7 + 3),1,1,_i_6);
              for (local_13c0 = 0; local_13c0 < 0x165; local_13c0 = local_13c0 + 1) {
                fwrite((void *)((long)&i_7 + 3),1,1,_i_6);
              }
              for (local_13c4 = 1;
                  sVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &length_2), (ulong)(long)local_13c4 < sVar15;
                  local_13c4 = local_13c4 + 1) {
                pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     &length_2,(long)local_13c4);
                i_7._3_1_ = reverse(*pvVar13);
                fwrite((void *)((long)&i_7 + 3),1,1,_i_6);
              }
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&length_2);
              local_938 = 0;
            }
            else {
              poVar10 = std::operator<<((ostream *)&std::cerr,"Failed to open input file");
              std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
              argv_local._4_4_ = 1;
              local_938 = 1;
            }
            std::ifstream::~ifstream
                      (&bytes_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            if (local_938 != 0) goto LAB_0010bc2f;
          }
          argv_local._4_4_ = 0;
          local_938 = 1;
        }
        else {
          wave::File::File((File *)&content_2.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)local_cc8);
          EVar3 = wave::File::Open((File *)&content_2.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (string *)local_58,kOut);
          if (EVar3 == kNoError) {
            std::ifstream::ifstream
                      (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (string *)(output_file.field_2._M_local_buf + 8),_S_bin);
            bVar2 = std::ios::operator!((ios *)((long)&bytes.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               + *(long *)(bytes.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + -0x18)));
            if ((bVar2 & 1) == 0) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&length);
              poVar10 = std::operator<<((ostream *)&std::cout,
                                        "Converting Orao TAP tape to WAV format.");
              std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
              std::istream::seekg((long)&bytes.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,_S_beg);
              auVar17 = std::istream::tellg();
              local_f00 = auVar17._8_8_;
              __range2 = auVar17._0_8_;
              sVar12 = std::fpos::operator_cast_to_long((fpos *)&__range2);
              local_ef8 = sVar12 - 1;
              std::istream::seekg((long)&bytes.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,_S_cur);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&length,local_ef8)
              ;
              pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&length,
                                   0);
              std::istream::read((char *)&bytes.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)pvVar13);
              __end2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&length);
              _j = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&length);
              while (bVar16 = __gnu_cxx::operator!=
                                        (&__end2,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)&j), bVar16) {
                pbVar14 = __gnu_cxx::
                          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ::operator*(&__end2);
                bVar2 = *pbVar14;
                for (local_f28 = 0; local_f28 < 8; local_f28 = local_f28 + 1) {
                  if (((int)(uint)bVar2 >> (7U - (char)local_f28 & 0x1f) & 1U) == 0) {
                    orao_output_wave((vector<float,_std::allocator<float>_> *)local_cc8,24576.0,9);
                    orao_output_wave((vector<float,_std::allocator<float>_> *)local_cc8,-24576.0,9);
                  }
                  else {
                    orao_output_wave((vector<float,_std::allocator<float>_> *)local_cc8,24576.0,0x11
                                    );
                    orao_output_wave((vector<float,_std::allocator<float>_> *)local_cc8,-24576.0,
                                     0x11);
                  }
                }
                __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator++(&__end2);
              }
              EVar3 = wave::File::Write((File *)&content_2.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                                        (vector<float,_std::allocator<float>_> *)local_cc8);
              if (EVar3 != kNoError) {
                poVar10 = std::operator<<((ostream *)&std::cout,
                                          "Something went wrong while writing output file.");
                std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
              }
              argv_local._4_4_ = (uint)(EVar3 != kNoError);
              local_938 = 1;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&length);
            }
            else {
              poVar10 = std::operator<<((ostream *)&std::cerr,"Failed to open input file");
              std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
              argv_local._4_4_ = 1;
              local_938 = 1;
            }
            std::ifstream::~ifstream
                      (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          else {
            poVar10 = std::operator<<((ostream *)&std::cerr,
                                      "Something went wrong while opening output file.");
            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
            argv_local._4_4_ = 1;
            local_938 = 1;
          }
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)local_cc8);
          wave::File::~File((File *)&content_2.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      else {
        wave::File::File((File *)&content_1.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)local_c68);
        fp_1._4_4_ = wave::File::Open((File *)&content_1.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (string *)((long)&output_file.field_2 + 8),kIn);
        if (fp_1._4_4_ == kNoError) {
          fp_1._4_4_ = wave::File::Read((File *)&content_1.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                                        (vector<float,_std::allocator<float>_> *)local_c68);
          if (fp_1._4_4_ == kNoError) {
            pcVar4 = (char *)std::__cxx11::string::c_str();
            numSamples_1 = (size_t)fopen(pcVar4,"wb");
            poVar10 = std::operator<<((ostream *)&std::cout,
                                      "Converting Orao WAV tape to old TAP format.");
            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
            poVar10 = std::operator<<((ostream *)&std::cout,
                                      "WARNING: Header is not formed well, so some emulators may not work."
                                     );
            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
            _bitcounter_1 =
                 (double)std::vector<float,_std::allocator<float>_>::size
                                   ((vector<float,_std::allocator<float>_> *)local_c68);
            iStack_c84 = 0;
            i_2._3_1_ = 0;
            i_2._2_1_ = 0;
            i_2._1_1_ = '\0';
            i_2._0_1_ = 0;
            i_3._7_1_ = 0x68;
            fwrite((void *)((long)&i_3 + 7),1,1,(FILE *)numSamples_1);
            i_3._7_1_ = 1;
            fwrite((void *)((long)&i_3 + 7),1,1,(FILE *)numSamples_1);
            i_3._7_1_ = 0;
            fwrite((void *)((long)&i_3 + 7),1,1,(FILE *)numSamples_1);
            for (i_3._0_4_ = 0; (int)i_3 < 0x165; i_3._0_4_ = (int)i_3 + 1) {
              fwrite((void *)((long)&i_3 + 7),1,1,(FILE *)numSamples_1);
            }
            for (currentSample_1 = 0.0; (ulong)currentSample_1 < (ulong)_bitcounter_1;
                currentSample_1 = (double)((long)currentSample_1 + 1)) {
              pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)local_c68,
                                   (size_type)currentSample_1);
              fVar1 = *pvVar11;
              if ((bool)i_2._1_1_ == 0.0 < fVar1) {
                iStack_c84 = iStack_c84 + 1;
              }
              else {
                i_2._2_1_ = 0xb < iStack_c84;
                if ((i_2._3_1_ & 1) == 0) {
                  i_2._2_1_ = 0;
                  if (10 < iStack_c84) {
                    i_2._2_1_ = 0x80;
                  }
                  i_3._7_1_ = (byte)((int)(uint)i_3._7_1_ >> 1) | i_2._2_1_;
                  if ((byte)i_2 == 7) {
                    fwrite((void *)((long)&i_3 + 7),1,1,(FILE *)numSamples_1);
                    i_3._7_1_ = 0;
                    i_2._0_1_ = 0;
                  }
                  else {
                    i_2._0_1_ = (byte)i_2 + 1;
                  }
                  i_2._3_1_ = 1;
                }
                else {
                  i_2._3_1_ = 0;
                }
                iStack_c84 = 0;
              }
              i_2._1_1_ = 0.0 < fVar1;
            }
            if ((byte)i_2 != 0) {
              for (write_file.impl_._M_t.
                   super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>
                   .super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl._0_4_ =
                        (uint)(byte)i_2;
                  (int)(uint)write_file.impl_._M_t.
                             super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>
                             .super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl < 7;
                  write_file.impl_._M_t.
                  super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>
                  .super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl._0_4_ =
                       (uint)write_file.impl_._M_t.
                             super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>
                             .super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl + 1) {
                i_3._7_1_ = (byte)((int)(uint)i_3._7_1_ >> 1);
              }
              fwrite((void *)((long)&i_3 + 7),1,1,(FILE *)numSamples_1);
            }
            fclose((FILE *)numSamples_1);
            argv_local._4_4_ = 0;
          }
          else {
            poVar10 = std::operator<<((ostream *)&std::cout,
                                      "Something went wrong while reading input file.");
            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
            argv_local._4_4_ = 1;
          }
        }
        else {
          poVar10 = std::operator<<((ostream *)&std::cerr,
                                    "Something went wrong while opening input file.");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          argv_local._4_4_ = 1;
        }
        local_938 = 1;
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)local_c68);
        wave::File::~File((File *)&content_1.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    else {
      wave::File::File((File *)&content.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_c08);
      fp._4_4_ = wave::File::Open((File *)&content.super__Vector_base<float,_std::allocator<float>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (string *)((long)&output_file.field_2 + 8),kIn);
      if (fp._4_4_ == kNoError) {
        fp._4_4_ = wave::File::Read((File *)&content.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (vector<float,_std::allocator<float>_> *)local_c08);
        if (fp._4_4_ == kNoError) {
          pcVar4 = (char *)std::__cxx11::string::c_str();
          numSamples = (size_t)fopen(pcVar4,"wb");
          poVar10 = std::operator<<((ostream *)&std::cout,"Converting Orao WAV tape to TAP format.")
          ;
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          _bitcounter = (double)std::vector<float,_std::allocator<float>_>::size
                                          ((vector<float,_std::allocator<float>_> *)local_c08);
          iStack_c24 = 0;
          local_c25 = 0;
          local_c26 = 0;
          local_c27 = '\0';
          local_c28 = 0;
          i._7_1_ = 0x4f;
          fwrite((void *)((long)&i + 7),1,1,(FILE *)numSamples);
          for (currentSample = 0.0; (ulong)currentSample < (ulong)_bitcounter;
              currentSample = (double)((long)currentSample + 1)) {
            pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_c08,
                                 (size_type)currentSample);
            fVar1 = *pvVar11;
            if ((bool)local_c27 == 0.0 < fVar1) {
              iStack_c24 = iStack_c24 + 1;
            }
            else {
              local_c26 = 0xb < iStack_c24;
              if ((local_c25 & 1) == 0) {
                local_c26 = 10 < iStack_c24;
                i._7_1_ = i._7_1_ << 1 | local_c26;
                if (local_c28 == 7) {
                  fwrite((void *)((long)&i + 7),1,1,(FILE *)numSamples);
                  i._7_1_ = 0;
                  local_c28 = 0;
                }
                else {
                  local_c28 = local_c28 + 1;
                }
                local_c25 = 1;
              }
              else {
                local_c25 = 0;
              }
              iStack_c24 = 0;
            }
            local_c27 = 0.0 < fVar1;
          }
          if (local_c28 != 0) {
            for (read_file_1.impl_._M_t.
                 super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>.
                 super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl._0_4_ =
                      (uint)local_c28;
                (int)(uint)read_file_1.impl_._M_t.
                           super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>
                           .super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl < 7;
                read_file_1.impl_._M_t.
                super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>._M_t
                .super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>.
                super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl._0_4_ =
                     (uint)read_file_1.impl_._M_t.
                           super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>
                           .super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl + 1) {
              i._7_1_ = i._7_1_ << 1;
            }
            fwrite((void *)((long)&i + 7),1,1,(FILE *)numSamples);
          }
          fclose((FILE *)numSamples);
          argv_local._4_4_ = 0;
        }
        else {
          poVar10 = std::operator<<((ostream *)&std::cout,
                                    "Something went wrong while reading input file.");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          argv_local._4_4_ = 1;
        }
      }
      else {
        poVar10 = std::operator<<((ostream *)&std::cerr,
                                  "Something went wrong while opening input file.");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
      }
      local_938 = 1;
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_c08);
      wave::File::~File((File *)&content.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
    }
  }
LAB_0010bc2f:
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(output_file.field_2._M_local_buf + 8));
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char* argv[])
{
	std::string input_file;
	std::string output_file;
	bool wav_to_tap = false;
	bool wav_to_oldtap = false;
	bool tap_to_wav = false;
	bool old_to_new = false;
	bool new_to_old = false;
	try
	{
		std::string name = argv[0];
		cxxopts::Options options(name.c_str(), name + " - Orao cassette tape tool");
		options
			.positional_help("[optional args]")
			.show_positional_help();

		options
			.allow_unrecognised_options()
			.add_options()
			("i,input", "Input", cxxopts::value<std::string>())
			("o,output", "Output file", cxxopts::value<std::string>())
			("tap", "Convert WAV to TAP", cxxopts::value<bool>())
			("oldtap", "Convert WAV to oldTAP", cxxopts::value<bool>())
			("wav", "Convert TAP to WAV", cxxopts::value<bool>())
			("old2new", "Convert old TAP to new TAP", cxxopts::value<bool>())
			("new2old", "Convert new TAP to old TAP <WARNING: header will not be good>", cxxopts::value<bool>())
			("help", "Print help")
		;

		options.parse_positional({"input", "output"});

		auto result = options.parse(argc, argv);

		if (result.count("help") || result.arguments().empty())
		{
			std::cout << options.help() << std::endl;
			exit(0);
		}

		if (result.count("input"))
		{
			input_file = result["input"].as<std::string>();
		} else {
			std::cerr << "Input file is mandatory." << std::endl;
			return 1;
		}

		if (result.count("output"))
		{
			output_file = result["output"].as<std::string>();
		} else {
			std::cerr << "Output file is mandatory." << std::endl;	
			return 1;
		}

		if (result.count("wav") && result.count("tap") && result.count("old2new") && result.count("new2old") && result.count("oldtap"))
		{
			std::cerr << "Only one target format is possible." << std::endl;	
			return 1;
		}
		if (!result.count("wav") && !result.count("tap") && !result.count("old2new") && !result.count("new2old") && !result.count("oldtap"))
		{
			std::cerr << "Target format is mandatory." << std::endl;	
			return 1;
		}
		if (result.count("wav")) tap_to_wav = true;
		if (result.count("tap")) wav_to_tap = true;
		if (result.count("oldtap")) wav_to_oldtap = true;
		if (result.count("old2new")) old_to_new = true;
		if (result.count("new2old")) new_to_old = true;

	}
	catch (const cxxopts::OptionException& e)
	{
		std::cerr << "Error parsing options: " << e.what() << std::endl;
		return 1;
	}

	if (wav_to_tap) {
		wave::File read_file;
		std::vector<float> content;	
		wave::Error err = read_file.Open(input_file, wave::kIn);
		if (err) {
			std::cerr << "Something went wrong while opening input file." << std::endl;
			return 1;
		}
		err = read_file.Read(&content);
		if (err) {
			std::cout << "Something went wrong while reading input file." << std::endl;
			return 1;
		}
		FILE *fp = fopen(output_file.c_str(), "wb");

		std::cout << "Converting Orao WAV tape to TAP format." << std::endl;
		size_t numSamples = content.size();
		int cnt = 0;
		bool firstPart = false;
		uint8_t bit = 0;
		uint8_t prevVal = 0;
		uint8_t bitcounter = 0;
		uint8_t data = 0x4f;
		// Make first byte same as in tool from Josip
		fwrite(&data, 1, 1, fp);
		for (size_t i = 0; i < numSamples; i++)
		{
			double currentSample = content[i];
			uint8_t val = (currentSample > 0) ? 1 : 0;
			if (prevVal == val)
				cnt++;
			else {
				bit = (cnt>=12) ? 1 : 0;
				if (!firstPart) {
						bit = (cnt>=11) ? 1 : 0;
						data = (data << 1) | bit;
						if (bitcounter == 7) {
							fwrite(&data, 1, 1, fp);
							data = 0;
							bitcounter = 0;
						} else {
							bitcounter++;
						}
					firstPart = true;
				} else {
					firstPart = false;
				}
				cnt = 0;
			}
			prevVal = val;
		}
		if (bitcounter != 0) {
			for(int i=bitcounter; i<7; i++)
				data = (data << 1);
			fwrite(&data, 1, 1, fp);
		}
		fclose(fp);
		return 0;
	}
	if (wav_to_oldtap) {
		wave::File read_file;
		std::vector<float> content;	
		wave::Error err = read_file.Open(input_file, wave::kIn);
		if (err) {
			std::cerr << "Something went wrong while opening input file." << std::endl;
			return 1;
		}
		err = read_file.Read(&content);
		if (err) {
			std::cout << "Something went wrong while reading input file." << std::endl;
			return 1;
		}
		FILE *fp = fopen(output_file.c_str(), "wb");

		std::cout << "Converting Orao WAV tape to old TAP format." << std::endl;
		std::cout << "WARNING: Header is not formed well, so some emulators may not work." << std::endl;
		size_t numSamples = content.size();
		int cnt = 0;
		bool firstPart = false;
		uint8_t bit = 0;
		uint8_t prevVal = 0;
		uint8_t bitcounter = 0;
		uint8_t data = 0x68; fwrite(&data, 1, 1, fp);
		data = 0x01; fwrite(&data, 1, 1, fp);
		data = 0x00; fwrite(&data, 1, 1, fp);
		for (int i = 0; i < ORAO_HEADER_SIZE -3; i++) {
			fwrite(&data, 1, 1, fp); // fill rest of header with 0
		}
		for (size_t i = 0; i < numSamples; i++)
		{
			double currentSample = content[i];
			uint8_t val = (currentSample > 0) ? 1 : 0;
			if (prevVal == val)
				cnt++;
			else {
				bit = (cnt>=12) ? 1 : 0;
				if (!firstPart) {
						bit = (cnt>=11) ? 0x80 : 0;
						data = (data >> 1) | bit;
						if (bitcounter == 7) {
							fwrite(&data, 1, 1, fp);
							data = 0;
							bitcounter = 0;
						} else {
							bitcounter++;
						}
					firstPart = true;
				} else {
					firstPart = false;
				}
				cnt = 0;
			}
			prevVal = val;
		}
		if (bitcounter != 0) {
			for(int i=bitcounter; i<7; i++)
				data = (data >> 1);
			fwrite(&data, 1, 1, fp);
		}
		fclose(fp);
		return 0;
	}
	if (tap_to_wav) {
		wave::File write_file;
		std::vector<float> content;	
		wave::Error err = write_file.Open(output_file, wave::kOut);
		if (err) {
			std::cerr << "Something went wrong while opening output file." << std::endl;
			return 1;
		}
		std::ifstream fs(input_file, std::ios_base::binary);
		if (!fs) {
			std::cerr << "Failed to open input file" << std::endl;
			return 1;
		}
		std::vector<uint8_t> bytes; 
		std::cout << "Converting Orao TAP tape to WAV format." << std::endl;
		fs.seekg(0, fs.end);
		size_t length = size_t(fs.tellg())-1;
		fs.seekg(1, fs.beg);
		bytes.resize(length);
		fs.read(reinterpret_cast<char *>(&(bytes[0])), length);
		for(uint8_t byte : bytes) {
			for (int j=0;j<8;j++) {
				uint8_t b = (byte >> (7-j)) & 1;
				if (b==0) {
					orao_output_wave(&content, WAVE_LOW , ORAO_WAVE_ZERO);
					orao_output_wave(&content, WAVE_HIGH, ORAO_WAVE_ZERO);
				} else {
					orao_output_wave(&content, WAVE_LOW,  ORAO_WAVE_ONE);
					orao_output_wave(&content, WAVE_HIGH, ORAO_WAVE_ONE);
				}
			}
		}
		err = write_file.Write(content);
		if (err) {
			std::cout << "Something went wrong while writing output file." << std::endl;
			return 1;
		}
		return 0;
	}
	if (old_to_new) {
		std::ifstream fs(input_file, std::ios_base::binary);
		if (!fs) {
			std::cerr << "Failed to open input file" << std::endl;
			return 1;
		}
		std::vector<uint8_t> bytes; 
		std::cout << "Converting Orao old TAP tape to new TAP format." << std::endl;
		fs.seekg(0, fs.end);
		size_t length = size_t(fs.tellg());
		fs.seekg(0, fs.beg);
		bytes.resize(length);
		fs.read(reinterpret_cast<char *>(&(bytes[0])), length);
		FILE *fp = fopen(output_file.c_str(), "wb");
		uint8_t data = 0x4f;
		// Make first byte same as in tool from Josip
		fwrite(&data, 1, 1, fp);
		for (int i = ORAO_HEADER_SIZE; i < bytes.size(); i++) {
			data = reverse(bytes[i]);
			fwrite(&data, 1, 1, fp);
		}
	}
	if (new_to_old) {
		std::ifstream fs(input_file, std::ios_base::binary);
		if (!fs) {
			std::cerr << "Failed to open input file" << std::endl;
			return 1;
		}
		std::vector<uint8_t> bytes; 
		std::cout << "Converting Orao new TAP tape to old TAP format." << std::endl;
		std::cout << "WARNING: Header is not formed well, so some emulators may not work." << std::endl;
		fs.seekg(0, fs.end);
		size_t length = size_t(fs.tellg());
		fs.seekg(0, fs.beg);
		bytes.resize(length);
		fs.read(reinterpret_cast<char *>(&(bytes[0])), length);
		FILE *fp = fopen(output_file.c_str(), "wb");
		uint8_t data = 0x68; fwrite(&data, 1, 1, fp);
		data = 0x01; fwrite(&data, 1, 1, fp);
		data = 0x00; fwrite(&data, 1, 1, fp);
		for (int i = 0; i < ORAO_HEADER_SIZE -3; i++) {
			fwrite(&data, 1, 1, fp); // fill rest of header with 0
		}
		for (int i = 1; i < bytes.size(); i++) {
			data = reverse(bytes[i]);
			fwrite(&data, 1, 1, fp);
		}
	}
	return 0;
}